

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

bool __thiscall CDirectiveAlignFill::Validate(CDirectiveAlignFill *this,ValidateState *state)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int64_t iVar4;
  long lVar5;
  Architecture *pAVar6;
  long *in_RCX;
  long lVar7;
  char **local_20;
  
  iVar4 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar4;
  if ((this->valueExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
LAB_00171f01:
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 != 2) {
      bVar3 = isPowerOfTwo(this->value);
      if (!bVar3) {
        Logger::queueError<long>((Logger *)0x1,0x1919c7,(char *)&this->value,in_RCX);
        goto LAB_00171ff2;
      }
    }
    lVar2 = this->finalSize;
    iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
    if (iVar1 == 0) {
      lVar5 = FileManager::getPhysicalAddress(g_fileManager);
LAB_00171f8f:
      lVar5 = lVar5 % this->value;
      lVar7 = this->value - lVar5;
      if (lVar5 == 0) {
        lVar7 = 0;
      }
LAB_00171fa2:
      this->finalSize = lVar7;
    }
    else {
      if (iVar1 == 2) {
        lVar7 = this->value;
        goto LAB_00171fa2;
      }
      if (iVar1 == 1) {
        lVar5 = FileManager::getVirtualAddress(g_fileManager);
        goto LAB_00171f8f;
      }
    }
    if ((this->fillExpression).expression.
        super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      bVar3 = Expression::evaluateInteger<signed_char>(&this->fillExpression,&this->fillByte);
      if (!bVar3) {
        Logger::printError<>(FatalError,"Invalid fill value");
        goto LAB_00171ff2;
      }
    }
    pAVar6 = Architecture::current();
    (*pAVar6->_vptr_Architecture[3])(pAVar6);
    FileManager::advanceMemory(g_fileManager,this->finalSize);
    bVar3 = lVar2 != this->finalSize;
  }
  else {
    bVar3 = Expression::evaluateInteger<long>(&this->valueExpression,&this->value);
    if (bVar3) goto LAB_00171f01;
    local_20 = (char **)0x1919bd;
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 2) {
      local_20 = (char **)0x195072;
    }
    Logger::queueError<char_const*>((Logger *)0x2,0x1919b2,(char *)&local_20,local_20);
LAB_00171ff2:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CDirectiveAlignFill::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (valueExpression.isLoaded())
	{
		if (!valueExpression.evaluateInteger(value))
		{
			Logger::queueError(Logger::FatalError, "Invalid %s",mode == Fill ? "size" : "alignment");
			return false;
		}
	}

	if (mode != Fill && !isPowerOfTwo(value))
	{
		Logger::queueError(Logger::Error, "Invalid alignment %d", value);
		return false;
	}

	int64_t oldSize = finalSize;
	int64_t mod;
	switch (mode)
	{
	case AlignVirtual:
		mod = g_fileManager->getVirtualAddress() % value;
		finalSize = mod ? value-mod : 0;
		break;
	case AlignPhysical:
		mod = g_fileManager->getPhysicalAddress() % value;
		finalSize = mod ? value-mod : 0;
		break;
	case Fill:
		finalSize = value;
		break;
	}

	if (fillExpression.isLoaded())
	{
		if (!fillExpression.evaluateInteger(fillByte))
		{
			Logger::printError(Logger::FatalError, "Invalid fill value");
			return false;
		}
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(finalSize);

	bool result = oldSize != finalSize;
	oldSize = finalSize;
	return result;
}